

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O2

void __thiscall Track::clear(Track *this)

{
  Track local_30;
  
  Track(&local_30,0);
  operator=(this,&local_30);
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_30.m_sectors);
  return;
}

Assistant:

void Track::clear()
{
    *this = Track();
}